

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_ManPrintResults(Gia_Man_t *p,sat_solver *pSat,int nIter,abctime clk)

{
  uint uVar1;
  FILE *__stream;
  
  __stream = fopen("fault_stats.txt","a+");
  fprintf(__stream,"%s ",p->pName);
  fprintf(__stream,"%d ",(ulong)(uint)(p->vCis->nSize - p->nRegs));
  fprintf(__stream,"%d ",(ulong)(uint)(p->vCos->nSize - p->nRegs));
  fprintf(__stream,"%d ",(ulong)(uint)p->nRegs);
  uVar1 = Gia_ManAndNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nvars(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nclauses(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = sat_solver_nconflicts(pSat);
  fprintf(__stream,"%d ",(ulong)uVar1);
  fprintf(__stream,"%d ",(ulong)(uint)nIter);
  fprintf(__stream,"%.2f",(double)clk / 1000000.0);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManPrintResults( Gia_Man_t * p, sat_solver * pSat, int nIter, abctime clk )
{
    FILE * pTable = fopen( "fault_stats.txt", "a+" );

    fprintf( pTable, "%s ", Gia_ManName(p) );
    fprintf( pTable, "%d ", Gia_ManPiNum(p) );
    fprintf( pTable, "%d ", Gia_ManPoNum(p) );
    fprintf( pTable, "%d ", Gia_ManRegNum(p) );
    fprintf( pTable, "%d ", Gia_ManAndNum(p) );

    fprintf( pTable, "%d ", sat_solver_nvars(pSat) );
    fprintf( pTable, "%d ", sat_solver_nclauses(pSat) );
    fprintf( pTable, "%d ", sat_solver_nconflicts(pSat) );

    fprintf( pTable, "%d ", nIter );
    fprintf( pTable, "%.2f", 1.0*clk/CLOCKS_PER_SEC );
    fprintf( pTable, "\n" );
    fclose( pTable );
}